

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

MetaIterator __thiscall rtosc::Port::MetaContainer::find(MetaContainer *this,char *str)

{
  bool bVar1;
  int iVar2;
  MetaIterator *pMVar3;
  char *in_RSI;
  MetaIterator MVar4;
  MetaIterator __end1;
  MetaIterator __begin1;
  MetaContainer *__range1;
  MetaIterator x;
  MetaContainer *in_stack_ffffffffffffffb0;
  MetaIterator *local_40;
  MetaIterator local_38;
  char *local_20;
  char *local_10;
  char *local_8;
  
  local_20 = in_RSI;
  local_38 = begin(in_stack_ffffffffffffffb0);
  MVar4 = end((MetaContainer *)0x1058a6);
  while( true ) {
    local_40 = (MetaIterator *)MVar4.value;
    pMVar3 = (MetaIterator *)MVar4.title;
    bVar1 = MetaIterator::operator!=(&local_38,MVar4);
    if (!bVar1) break;
    pMVar3 = MetaIterator::operator*(&local_38);
    local_10 = pMVar3->title;
    local_8 = pMVar3->value;
    iVar2 = strcmp(local_10,local_20);
    if (iVar2 == 0) goto LAB_00105929;
    MetaIterator::operator++((MetaIterator *)MVar4.title);
  }
  MetaIterator::MetaIterator(local_40,(char *)pMVar3);
LAB_00105929:
  MVar4.value = local_8;
  MVar4.title = local_10;
  return MVar4;
}

Assistant:

Port::MetaIterator Port::MetaContainer::find(const char *str) const
{
    for(const auto x : *this)
        if(!strcmp(x.title, str))
            return x;
    return NULL;
}